

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

_Bool tp_join_tasks(thread_pool_t *tp)

{
  thread_pool_t *tp_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&tp->lock);
  do {
    pthread_cond_wait((pthread_cond_t *)&tp->no_task,(pthread_mutex_t *)&tp->lock);
  } while (tp->active_tasks != 0);
  pthread_mutex_unlock((pthread_mutex_t *)&tp->lock);
  return tp->active_tasks == 0;
}

Assistant:

bool tp_join_tasks(thread_pool_t *tp)
{
    pthread_mutex_lock(&tp->lock);

    do {
        pthread_cond_wait(&tp->no_task, &tp->lock);
    } while (tp->active_tasks > 0);

    pthread_mutex_unlock(&tp->lock);

    return tp->active_tasks == 0;
}